

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSocket.cpp
# Opt level: O0

void net_uv::UDPSocket::uv_on_udp_send(uv_udp_send_t *req,int status)

{
  undefined8 *__ptr;
  char *pcVar1;
  uv_buf_t *buf;
  int status_local;
  uv_udp_send_t *req_local;
  
  if (status != 0) {
    pcVar1 = uv_strerror(status);
    net_uvLog(3,"udp send error %s",pcVar1);
  }
  __ptr = (undefined8 *)req->data;
  free((void *)*__ptr);
  free(__ptr);
  free(req);
  return;
}

Assistant:

void UDPSocket::uv_on_udp_send(uv_udp_send_t *req, int status) 
{
	if (status != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "udp send error %s", uv_strerror(status));
	}
	uv_buf_t* buf = (uv_buf_t*)req->data;
	fc_free(buf->base);
	fc_free(buf);
	fc_free(req);
}